

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t pugi::impl::anon_unknown_0::strlength_wide(wchar_t *s)

{
  wchar_t *end;
  wchar_t *s_local;
  
  for (end = s; *end != L'\0'; end = end + 1) {
  }
  return (long)end - (long)s >> 2;
}

Assistant:

PUGI__FN size_t strlength_wide(const wchar_t* s)
	{
		assert(s);

	#ifdef PUGIXML_WCHAR_MODE
		return wcslen(s);
	#else
		const wchar_t* end = s;
		while (*end) end++;
		return static_cast<size_t>(end - s);
	#endif
	}